

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

void * Curl_hash_add(curl_hash *h,void *key,size_t key_len,void *p)

{
  curl_llist **ppcVar1;
  curl_llist *list;
  curl_llist_element *e;
  int iVar2;
  size_t sVar3;
  undefined8 *p_00;
  void *__dest;
  curl_llist *pcVar4;
  
  ppcVar1 = h->table;
  sVar3 = (*h->hash_func)(key,key_len,(long)h->slots);
  list = ppcVar1[sVar3];
  pcVar4 = list;
  do {
    e = pcVar4->head;
    if (e == (curl_llist_element *)0x0) {
LAB_00130836:
      p_00 = (undefined8 *)(*Curl_cmalloc)(0x18);
      if (p_00 != (undefined8 *)0x0) {
        __dest = (*Curl_cmalloc)(key_len);
        if (__dest == (void *)0x0) {
          (*Curl_cfree)(p_00);
        }
        else {
          memcpy(__dest,key,key_len);
          p_00[1] = __dest;
          p_00[2] = key_len;
          *p_00 = p;
          iVar2 = Curl_llist_insert_next(list,list->tail,p_00);
          if (iVar2 != 0) {
            h->size = h->size + 1;
            return p;
          }
          (*Curl_cfree)((void *)p_00[1]);
          (*Curl_cfree)(p_00);
        }
      }
      return (void *)0x0;
    }
    sVar3 = (*h->comp_func)(*(void **)((long)e->ptr + 8),*(size_t *)((long)e->ptr + 0x10),key,
                            key_len);
    if (sVar3 != 0) {
      Curl_llist_remove(list,e,h);
      h->size = h->size - 1;
      goto LAB_00130836;
    }
    pcVar4 = (curl_llist *)&e->next;
  } while( true );
}

Assistant:

void *
Curl_hash_add(struct curl_hash *h, void *key, size_t key_len, void *p)
{
  struct curl_hash_element  *he;
  struct curl_llist_element *le;
  struct curl_llist *l = FETCH_LIST (h, key, key_len);

  for(le = l->head; le; le = le->next) {
    he = (struct curl_hash_element *) le->ptr;
    if(h->comp_func(he->key, he->key_len, key, key_len)) {
      Curl_llist_remove(l, le, (void *)h);
      --h->size;
      break;
    }
  }

  he = mk_hash_element(key, key_len, p);
  if(he) {
    if(Curl_llist_insert_next(l, l->tail, he)) {
      ++h->size;
      return p; /* return the new entry */
    }
    /*
     * Couldn't insert it, destroy the 'he' element and the key again. We
     * don't call hash_element_dtor() since that would also call the
     * "destructor" for the actual data 'p'. When we fail, we shall not touch
     * that data.
     */
    free(he->key);
    free(he);
  }

  return NULL; /* failure */
}